

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O3

optional<ConfigKey> * __thiscall
ConfigKey::parse(optional<ConfigKey> *__return_storage_ptr__,ConfigKey *this,string_view value)

{
  pointer __s1;
  uint64_t uVar1;
  int iVar2;
  pointer pCVar3;
  uint64_t *puVar4;
  vector<ConfigKey,_std::allocator<ConfigKey>_> local_48;
  
  available();
  if (local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = &(local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
               super__Vector_impl_data._M_start)->defval_;
    do {
      if (((ConfigKey *)puVar4[-3] == this) &&
         ((__s1 = (((ConfigKey *)(puVar4 + -4))->key_)._M_dataplus._M_p, this == (ConfigKey *)0x0 ||
          (iVar2 = bcmp(__s1,(void *)value._M_len,(size_t)this), iVar2 == 0)))) {
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.key_._M_dataplus =
             (pointer)((long)&(__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>
                              )._M_payload.super__Optional_payload<ConfigKey,_true,_false,_false>.
                              super__Optional_payload_base<ConfigKey>._M_payload + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,__s1,__s1 + (long)&(this->key_)._M_dataplus._M_p
                  );
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.max_ = puVar4[2];
        uVar1 = puVar4[1];
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.defval_ = *puVar4;
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.min_ = uVar1;
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_engaged = true;
        std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_48);
        return __return_storage_ptr__;
      }
      pCVar3 = (pointer)(puVar4 + 3);
      puVar4 = puVar4 + 7;
    } while (pCVar3 != local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_48);
  (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
  super__Optional_payload<ConfigKey,_true,_false,_false>.super__Optional_payload_base<ConfigKey>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<ConfigKey> ConfigKey::parse(std::string_view value) {
    for (const auto &opt : ConfigKey::available()) {
        if (opt.key() == value) {
            return opt;
        }
    }
    return std::nullopt;
}